

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

uint64 crnlib::pack_etc1s_block
                 (etc1_block *dst_block,color_quad_u8 *pSrc_pixels,crn_etc1_pack_params *pack_params
                 )

{
  crn_etc_quality cVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  undefined1 *puVar7;
  results results;
  int scan [9];
  int refine_high [8];
  int refine_medium [4];
  uint8 selectors [16];
  etc1_optimizer optimizer;
  ulong local_1e0;
  uint local_1d8;
  int local_1d4;
  int local_1b8 [10];
  int local_190;
  undefined2 local_18c;
  undefined4 local_188;
  color_quad_u8 *local_180;
  undefined1 local_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined1 local_160;
  int local_158 [8];
  undefined8 local_138;
  int aiStack_130 [2];
  undefined1 local_128 [16];
  etc1_optimizer local_118;
  
  local_118.m_best_solution.m_selectors.m_p = (uchar *)0x0;
  local_118.m_best_solution.m_selectors.m_size = 0;
  local_118.m_best_solution.m_selectors.m_capacity = 0;
  local_118.m_luma.m_p = (unsigned_short *)0x0;
  local_118.m_luma.m_size = 0;
  local_118.m_luma.m_capacity = 0;
  local_118.m_sorted_luma[0].m_p = (uint *)0x0;
  local_118.m_sorted_luma[0].m_size = 0;
  local_118.m_sorted_luma[0].m_capacity = 0;
  local_118.m_sorted_luma[1].m_p = (uint *)0x0;
  local_118.m_sorted_luma[1].m_size = 0;
  local_118.m_sorted_luma[1].m_capacity = 0;
  local_118.m_selectors.m_p = (uchar *)0x0;
  local_118.m_selectors.m_size = 0;
  local_118.m_selectors.m_capacity = 0;
  local_118.m_best_selectors.m_p = (uchar *)0x0;
  local_118.m_best_selectors.m_size._0_1_ = 0;
  local_118.m_best_selectors._9_7_ = 0;
  local_118.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r = '\0';
  local_118.m_best_solution.m_coords._1_8_ = 0;
  local_118.m_best_solution.m_error = 0xffffffffffffffff;
  local_118.m_best_solution.m_valid = false;
  local_118.m_trial_solution.m_coords.m_color4 = false;
  local_118.m_trial_solution.m_coords.m_unscaled_color.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  local_118.m_trial_solution.m_coords.m_inten_table = 0;
  local_118.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
  local_118.m_trial_solution.m_selectors.m_size = 0;
  local_118.m_trial_solution.m_selectors.m_capacity = 0;
  local_118.m_trial_solution.m_error = 0xffffffffffffffff;
  local_118.m_trial_solution.m_valid = false;
  local_118.m_temp_selectors.m_p = (uchar *)0x0;
  local_118.m_temp_selectors.m_size = 0;
  local_118.m_temp_selectors.m_capacity = 0;
  local_118.m_pParams = (params *)0x0;
  local_118.m_pResult = (results *)0x0;
  local_118.m_pSorted_luma_indices = (uint32 *)0x0;
  local_118.m_pSorted_luma = (uint32 *)0x0;
  local_190 = 2;
  local_18c = 1;
  local_170 = (undefined8 *)&etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_168 = 1;
  local_188 = 0x10;
  local_178 = 0;
  local_160 = 0;
  puVar7 = local_128;
  local_180 = pSrc_pixels;
  etc1_optimizer::init(&local_118,(EVP_PKEY_CTX *)&local_190);
  local_1b8[4] = 0;
  local_1b8[5] = 1;
  local_1b8[6] = 2;
  local_1b8[7] = 3;
  local_1b8[0] = -4;
  local_1b8[1] = -3;
  local_1b8[2] = -2;
  local_1b8[3] = -1;
  local_1b8[8] = 4;
  cVar1 = pack_params->m_quality;
  iVar2 = (cVar1 == cCRNETCQualityMedium) + 1 + (uint)(cVar1 == cCRNETCQualityMedium);
  if (cVar1 == cCRNETCQualitySlow) {
    iVar2 = 9;
  }
  local_170 = (undefined8 *)((long)local_1b8 + (ulong)(9 - iVar2) * 2);
  local_168._0_4_ = iVar2;
  etc1_optimizer::compute(&local_118);
  if (local_190 != 0 && 6000 < local_1e0) {
    local_138._0_4_ = -3;
    local_138._4_4_ = -2;
    aiStack_130[0] = 2;
    aiStack_130[1] = 3;
    local_158[4] = 5;
    local_158[5] = 6;
    local_158[6] = 7;
    local_158[7] = 8;
    local_158[0] = -8;
    local_158[1] = -7;
    local_158[2] = -6;
    local_158[3] = -5;
    local_168._0_4_ = 2;
    if (12000 < local_1e0) {
      local_168._0_4_ = 8;
    }
    local_170 = (undefined8 *)((long)local_158 + (ulong)(8 - (int)local_168) * 2);
    if (local_190 == 1) {
      local_170 = &local_138;
      local_168._0_4_ = 4;
    }
    etc1_optimizer::compute(&local_118);
  }
  bVar4 = 8;
  iVar2 = 0;
  uVar3 = 0;
  do {
    lVar5 = 0;
    bVar6 = bVar4;
    do {
      uVar3 = uVar3 | (((byte)(&g_selector_index_to_etc1)[(byte)puVar7[lVar5]] & 1) << 0x10 |
                      (uint)((byte)(&g_selector_index_to_etc1)[(byte)puVar7[lVar5]] >> 1)) <<
                      (bVar6 & 0xf);
      bVar6 = bVar6 + 4;
      lVar5 = lVar5 + 1;
    } while ((int)lVar5 != 4);
    iVar2 = iVar2 + 1;
    bVar4 = bVar4 + 1;
    puVar7 = puVar7 + 4;
  } while (iVar2 != 4);
  (dst_block->field_0).m_uint64 =
       (ulong)(local_1d4 << 0x1a | 0x2000000U | (local_1d8 & 0xbfffff) << 3) |
       CONCAT44(uVar3,local_1d4 << 0x1d);
  etc1_optimizer::~etc1_optimizer(&local_118);
  return local_1e0;
}

Assistant:

uint64 pack_etc1s_block(etc1_block& dst_block, const color_quad_u8* pSrc_pixels, crn_etc1_pack_params& pack_params) {
  uint8 selectors[16];
  etc1_optimizer optimizer;
  etc1_optimizer::params params;
  params.m_pSrc_pixels = pSrc_pixels;
  params.m_num_src_pixels = 16;
  params.m_use_color4 = false;
  params.m_constrain_against_base_color5 = false;
  etc1_optimizer::results results;
  results.m_pSelectors = selectors;
  results.m_n = 16;
  optimizer.init(params, results);

  const int scan[] = {-4, -3, -2, -1, 0, 1, 2, 3, 4};
  params.m_scan_delta_size = pack_params.m_quality == cCRNETCQualitySlow ? CRNLIB_ARRAY_SIZE(scan) : pack_params.m_quality == cCRNETCQualityMedium ? 3 : 1;
  params.m_pScan_deltas = scan + ((CRNLIB_ARRAY_SIZE(scan) - params.m_scan_delta_size) >> 1);
  optimizer.compute();

  if (params.m_quality >= cCRNETCQualityMedium && results.m_error > 6000) {
    const int refine_medium[] = {-3, -2, 2, 3};
    const int refine_high[] = {-8, -7, -6, -5, 5, 6, 7, 8};
    if (params.m_quality == cCRNETCQualityMedium) {
      params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(refine_medium);
      params.m_pScan_deltas = refine_medium;
    } else {
      params.m_scan_delta_size = results.m_error > 12000 ? CRNLIB_ARRAY_SIZE(refine_high) : 2;
      params.m_pScan_deltas = refine_high + ((CRNLIB_ARRAY_SIZE(refine_high) - params.m_scan_delta_size) >> 1);
    }
    optimizer.compute();
  }

  uint32 selector = 0;
  for (uint32 i = 0, t = 8, h = 0; h < 4; h++, t -= 15) {
    for (uint32 w = 0; w < 4; w++, t += 4, i++) {
      uint32 s = g_selector_index_to_etc1[selectors[i]];
      selector |= (s >> 1 | (s & 1) << 16) << (t & 15);
    }
  }

  dst_block.m_uint64 = (uint64)selector << 32 | results.m_block_inten_table << 29 | results.m_block_inten_table << 26 | 1 << 25 | (results.m_block_color_unscaled.m_u32 & 0xFFFFFF) << 3;
  return results.m_error;
}